

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_chroma_mode2
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 *pUVar1;
  long lVar2;
  WORD32 WVar3;
  UWORD8 *pUVar4;
  UWORD8 *pUVar5;
  long lVar6;
  
  lVar2 = 0;
  WVar3 = nt;
  if (nt < 1) {
    WVar3 = 0;
  }
  pUVar4 = pu1_ref + (long)(nt * 4) + -4;
  pUVar1 = pu1_dst + 1;
  for (; lVar2 < nt * 2; lVar2 = lVar2 + 2) {
    pUVar5 = pUVar1;
    for (lVar6 = 0; (ulong)(uint)(WVar3 * 2) + lVar6 != 0; lVar6 = lVar6 + -2) {
      pUVar5[-1] = pUVar4[lVar6];
      *pUVar5 = pu1_ref[((int)lVar2 * -0x20 + -0x60 >> 5) + nt * 4 + (int)lVar6];
      pUVar5 = pUVar5 + dst_strd;
    }
    pUVar4 = pUVar4 + -2;
    pUVar1 = pUVar1 + 2;
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode2(UWORD8 *pu1_ref,
                                   WORD32 src_strd,
                                   UWORD8 *pu1_dst,
                                   WORD32 dst_strd,
                                   WORD32 nt,
                                   WORD32 mode)
{
    WORD32 row, col;

    WORD32 intra_pred_ang = 32;
    WORD32 idx_u, idx_v;
    UNUSED(src_strd);
    UNUSED(mode);
    /* For the angle 45, replication is done from the corresponding angle */
    /* intra_pred_ang = tan(angle) in q5 format */
    for(col = 0; col < (2 * nt); col += 2)
    {
        idx_u = ((col + 1) * intra_pred_ang) >> 5; /* Use idx++ */
        idx_v = (((col + 1) + 1) * intra_pred_ang) >> 5; /* Use idx++ */
        for(row = 0; row < nt; row++)
        {
            pu1_dst[col + (row * dst_strd)] = pu1_ref[(4 * nt) - 2 * row - idx_u - 3];
            pu1_dst[(col + 1) + (row * dst_strd)] = pu1_ref[(4 * nt) - 2 * row - idx_v - 1];
        }
    }

}